

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void table_select(ge_precomp *t,int pos,char b)

{
  crypto_word_t cVar1;
  long lVar2;
  undefined1 local_170 [8];
  ge_precomp minust;
  fe xy2d;
  fe yminusx;
  fe yplusx;
  byte local_78 [4];
  int i;
  uint8_t t_bytes [3] [32];
  uint8_t babs;
  uint8_t bnegative;
  char b_local;
  int pos_local;
  ge_precomp *t_local;
  
  t_bytes[2][0x1b] = b;
  t_bytes[2]._28_4_ = pos;
  cVar1 = constant_time_msb_w((long)b);
  t_bytes[2][0x1a] = (uint8_t)cVar1;
  t_bytes[2][0x19] = t_bytes[2][0x1b] + (t_bytes[2][0x1a] & t_bytes[2][0x1b]) * -2;
  memset(local_78,0,0x60);
  cVar1 = constant_time_is_zero_w((long)(char)t_bytes[2][0x1b]);
  local_78[0] = (byte)cVar1 & 1;
  cVar1 = constant_time_is_zero_w((long)(char)t_bytes[2][0x1b]);
  t_bytes[0][0x18] = (byte)cVar1 & 1;
  for (yplusx.v[4]._4_4_ = 0; yplusx.v[4]._4_4_ < 8; yplusx.v[4]._4_4_ = yplusx.v[4]._4_4_ + 1) {
    lVar2 = (long)(int)t_bytes[2]._28_4_;
    cVar1 = constant_time_eq_w((ulong)t_bytes[2][0x19],(long)(yplusx.v[4]._4_4_ + 1));
    constant_time_conditional_memxor(local_78,k25519Precomp[lVar2] + yplusx.v[4]._4_4_,0x60,cVar1);
  }
  fe_frombytes_strict((fe *)(yminusx.v + 4),local_78);
  fe_frombytes_strict((fe *)(xy2d.v + 4),t_bytes[0] + 0x18);
  fe_frombytes_strict((fe *)(minust.xy2d.v + 4),t_bytes[1] + 0x18);
  fe_copy_lt(&t->yplusx,(fe *)(yminusx.v + 4));
  fe_copy_lt(&t->yminusx,(fe *)(xy2d.v + 4));
  fe_copy_lt(&t->xy2d,(fe *)(minust.xy2d.v + 4));
  fe_copy_lt((fe_loose *)local_170,(fe *)(xy2d.v + 4));
  fe_copy_lt((fe_loose *)(minust.yplusx.v + 4),(fe *)(yminusx.v + 4));
  fe_neg((fe_loose *)(minust.yminusx.v + 4),(fe *)(minust.xy2d.v + 4));
  cmov(t,(ge_precomp *)local_170,(uint8_t)((int)(uint)t_bytes[2][0x1a] >> 7));
  return;
}

Assistant:

static void table_select(ge_precomp *t, const int pos, const signed char b) {
  uint8_t bnegative = constant_time_msb_w(b);
  uint8_t babs = b - ((bnegative & b) << 1);

  uint8_t t_bytes[3][32] = {
      {static_cast<uint8_t>(constant_time_is_zero_w(b) & 1)},
      {static_cast<uint8_t>(constant_time_is_zero_w(b) & 1)},
      {0}};
#if defined(__clang__)  // materialize for vectorization, 6% speedup
  __asm__("" : "+m"(t_bytes) : /*no inputs*/);
#endif
  static_assert(sizeof(t_bytes) == sizeof(k25519Precomp[pos][0]), "");
  for (int i = 0; i < 8; i++) {
    constant_time_conditional_memxor(t_bytes, k25519Precomp[pos][i],
                                     sizeof(t_bytes),
                                     constant_time_eq_w(babs, 1 + i));
  }

  fe yplusx, yminusx, xy2d;
  fe_frombytes_strict(&yplusx, t_bytes[0]);
  fe_frombytes_strict(&yminusx, t_bytes[1]);
  fe_frombytes_strict(&xy2d, t_bytes[2]);

  fe_copy_lt(&t->yplusx, &yplusx);
  fe_copy_lt(&t->yminusx, &yminusx);
  fe_copy_lt(&t->xy2d, &xy2d);

  ge_precomp minust;
  fe_copy_lt(&minust.yplusx, &yminusx);
  fe_copy_lt(&minust.yminusx, &yplusx);
  fe_neg(&minust.xy2d, &xy2d);
  cmov(t, &minust, bnegative >> 7);
}